

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Glucose::vec<Glucose::vec<unsigned_int>_>::capacity
          (vec<Glucose::vec<unsigned_int>_> *this,int min_cap)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  undefined8 uVar4;
  int in_ESI;
  undefined8 *in_RDI;
  int add;
  
  if (in_ESI <= *(int *)((long)in_RDI + 0xc)) {
    return;
  }
  iVar1 = imax((in_ESI - *(int *)((long)in_RDI + 0xc)) + 1U & 0xfffffffe,
               (*(int *)((long)in_RDI + 0xc) >> 1) + 2U & 0xfffffffe);
  if (iVar1 <= 0x7fffffff - *(int *)((long)in_RDI + 0xc)) {
    iVar1 = iVar1 + *(int *)((long)in_RDI + 0xc);
    *(int *)((long)in_RDI + 0xc) = iVar1;
    pvVar2 = realloc((void *)*in_RDI,(long)iVar1 << 4);
    *in_RDI = pvVar2;
    if (pvVar2 != (void *)0x0) {
      return;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0xc) {
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void vec<T>::capacity(int min_cap) {
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap || ((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM)
        throw OutOfMemoryException();
 }